

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall
semver::detail::version_parser::parse_build_identifier(version_parser *this,string *out)

{
  pointer ptVar1;
  token_stream *ptVar2;
  size_t sVar3;
  pointer ptVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  char *pcVar8;
  from_chars_result fVar9;
  string result;
  token token;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 local_40;
  char *local_38;
  
  local_58 = 0;
  local_50 = 0;
  ptVar2 = this->stream;
  sVar3 = ptVar2->current;
  ptVar4 = (ptVar2->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start;
  ptVar1 = ptVar4 + sVar3;
  uVar5._0_1_ = ptVar1->type;
  uVar5._1_2_ = ptVar1->value;
  uVar5._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
  pcVar8 = ptVar4[sVar3].lexeme;
  ptVar2->current = sVar3 + 1;
  local_60 = &local_50;
  while( true ) {
    local_40 = uVar5;
    local_38 = pcVar8;
    if ((char)uVar5 == '\x06') {
      std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> *)
                 ((long)&local_40 + 1));
      std::__cxx11::string::push_back((char)&local_60);
    }
    else {
      uVar6 = (uint)uVar5 & 0xff;
      if (uVar6 == 5) {
        std::get<2UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                  ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> *)
                   ((long)&local_40 + 1));
      }
      else if (uVar6 != 4) {
        uVar7 = 0x16;
        goto LAB_0015e207;
      }
      std::__cxx11::string::push_back((char)&local_60);
    }
    ptVar2 = this->stream;
    sVar3 = ptVar2->current;
    ptVar4 = (ptVar2->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar1 = ptVar4 + sVar3;
    uVar5._0_1_ = ptVar1->type;
    uVar5._1_2_ = ptVar1->value;
    uVar5._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
    if (2 < (uVar5 & 0xff) - 4) break;
    pcVar8 = ptVar4[sVar3].lexeme;
    ptVar2->current = sVar3 + 1;
  }
  std::__cxx11::string::_M_assign((string *)out);
  pcVar8 = (this->stream->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start[this->stream->current].lexeme;
  uVar7 = 0;
LAB_0015e207:
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  fVar9.super_from_chars_result._8_8_ = uVar7;
  fVar9.super_from_chars_result.ptr = pcVar8;
  return (from_chars_result)fVar9.super_from_chars_result;
}

Assistant:

parse_build_identifier(std::string& out) {
    std::string result;
    token token = stream.advance();

    do {
      switch (token.type) {
      case token_type::hyphen:
        result.push_back('-');
        break;
      case token_type::letter:
        result.push_back(std::get<char>(token.value));
        break;
      case token_type::digit:
      {
        const auto digit = std::get<std::uint8_t>(token.value);
        result.push_back(to_char(digit));
        break;
      }
      default:
        return failure(token.lexeme);
      }
    } while (stream.advanceIfMatch(token, token_type::hyphen) || stream.advanceIfMatch(token, token_type::letter) || stream.advanceIfMatch(token, token_type::digit));

    out = result;
    return success(stream.peek().lexeme);
  }